

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

size_t __thiscall Graph::reachableInPath(Graph *this,pathType *path,size_t startIndex,int speed)

{
  int iVar1;
  pointer ppEVar2;
  Edge *pEVar3;
  
  ppEVar2 = (path->super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  for (; (0 < speed &&
         (startIndex <
          ((long)(path->super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3) - 1U));
      startIndex = startIndex + 1) {
    pEVar3 = ppEVar2[startIndex];
    iVar1 = pEVar3->maxSpeed;
    if (iVar1 < speed) {
      speed = iVar1;
    }
    speed = speed - pEVar3->length;
  }
  return startIndex;
}

Assistant:

size_t Graph::reachableInPath(const pathType& path, size_t startIndex, int speed) {
  while(speed > 0 && startIndex < path.size()-1) {
    speed = std::min(speed, path[startIndex]->maxSpeed);
    speed -= path[startIndex++]->length;
  }
  return startIndex;
}